

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall Fl_Help_View::leftline(Fl_Help_View *this,int left)

{
  int total;
  int iVar1;
  int pos;
  
  if (this->value_ != (char *)0x0) {
    iVar1 = this->scrollbar_size_;
    if (iVar1 == 0) {
      iVar1 = Fl::scrollbar_size();
    }
    total = this->hsize_;
    iVar1 = (this->super_Fl_Group).super_Fl_Widget.w_ - iVar1;
    pos = left;
    if (total < left) {
      pos = total;
    }
    if (total < iVar1) {
      pos = 0;
    }
    if (left < 0) {
      pos = 0;
    }
    this->leftline_ = pos;
    Fl_Slider::scrollvalue(&(this->hscrollbar_).super_Fl_Slider,pos,iVar1,0,total);
    Fl_Widget::redraw((Fl_Widget *)this);
    return;
  }
  return;
}

Assistant:

void
Fl_Help_View::leftline(int left)	// I - Left position
{
  if (!value_)
    return;

  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  if (hsize_ < (w() - scrollsize) || left < 0)
    left = 0;
  else if (left > hsize_)
    left = hsize_;

  leftline_ = left;

  hscrollbar_.value(leftline_, w() - scrollsize, 0, hsize_);

  redraw();
}